

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_test.cc
# Opt level: O2

bool __thiscall
FileTest::GetInstructionBytes
          (FileTest *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,string *key)

{
  bool bVar1;
  string value;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  bVar1 = GetInstruction(this,&local_30,key);
  if (bVar1) {
    bVar1 = ConvertToBytes(this,out,&local_30);
  }
  else {
    bVar1 = false;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return bVar1;
}

Assistant:

bool FileTest::GetInstructionBytes(std::vector<uint8_t> *out,
                                   const std::string &key) {
  std::string value;
  return GetInstruction(&value, key) && ConvertToBytes(out, value);
}